

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O1

_Bool do_constant_folding_cond_eq(TCGCond c)

{
  int extraout_EDX;
  uint in_ESI;
  uint uVar1;
  
  uVar1 = c - TCG_COND_LT;
  if ((uVar1 < 0xc) && ((0xfcfU >> (uVar1 & 0x1f) & 1) != 0)) {
    return (0x54aU >> (uVar1 & 0x1f) & 1) != 0;
  }
  do_constant_folding_cond_eq_cold_1();
  if ((uVar1 < 0x101) && ((uVar1 & 7) == 0)) {
    if ((in_ESI < 0x101) && ((in_ESI & 7) == 0)) {
      if (extraout_EDX + 0x200000U < 0x400000) {
        return (_Bool)((char)in_ESI * '\x04' - 0x20U & 0xe0 | (char)(uVar1 >> 3) - 1U & 0x1f);
      }
      __assert_fail("data == sextract32(data, 0, SIMD_DATA_BITS)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                    ,0x51,"uint32_t simd_desc_tricore(uint32_t, uint32_t, int32_t)");
    }
    __assert_fail("maxsz % 8 == 0 && maxsz <= (8 << SIMD_MAXSZ_BITS)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                  ,0x50,"uint32_t simd_desc_tricore(uint32_t, uint32_t, int32_t)");
  }
  __assert_fail("oprsz % 8 == 0 && oprsz <= (8 << SIMD_OPRSZ_BITS)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                ,0x4f,"uint32_t simd_desc_tricore(uint32_t, uint32_t, int32_t)");
}

Assistant:

static bool do_constant_folding_cond_eq(TCGCond c)
{
    switch (c) {
    case TCG_COND_GT:
    case TCG_COND_LTU:
    case TCG_COND_LT:
    case TCG_COND_GTU:
    case TCG_COND_NE:
        return 0;
    case TCG_COND_GE:
    case TCG_COND_GEU:
    case TCG_COND_LE:
    case TCG_COND_LEU:
    case TCG_COND_EQ:
        return 1;
    default:
        tcg_abort();
    }
}